

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O3

void __thiscall llvm::detail::IEEEFloat::initFromQuadrupleAPInt(IEEEFloat *this,APInt *api)

{
  byte bVar1;
  uint64_t uVar2;
  ulong uVar3;
  uint64_t *puVar4;
  byte bVar5;
  ulong uVar6;
  ushort uVar7;
  
  if (api->BitWidth != 0x80) {
    __assert_fail("api.getBitWidth()==128",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xc1b,"void llvm::detail::IEEEFloat::initFromQuadrupleAPInt(const APInt &)");
  }
  uVar2 = *(api->U).pVal;
  uVar3 = (api->U).pVal[1];
  uVar7 = (ushort)(uVar3 >> 0x30) & 0x7fff;
  uVar6 = uVar3 & 0xffffffffffff;
  this->semantics = (fltSemantics *)semIEEEquad;
  puVar4 = (uint64_t *)operator_new__(0x10);
  (this->significand).parts = puVar4;
  bVar1 = this->field_0x12;
  bVar5 = (byte)(uVar3 >> 0x3c) & 8;
  if (((uVar3 & 0x7fff000000000000) == 0 && uVar2 == 0) && uVar6 == 0) {
    bVar5 = bVar1 & 0xf0 | bVar5 | 3;
  }
  else {
    if ((uVar7 != 0x7fff || uVar2 != 0) || uVar6 != 0) {
      if ((uVar7 == 0x7fff) && (uVar2 != 0 || uVar6 != 0)) {
        this->field_0x12 = (bVar1 & 0xf0 | bVar5) + 1;
        *puVar4 = uVar2;
        puVar4[1] = uVar6;
        return;
      }
      this->field_0x12 = bVar1 & 0xf0 | bVar5 | 2;
      this->exponent = uVar7 + 0xc001;
      *puVar4 = uVar2;
      puVar4[1] = uVar6;
      if ((uVar3 & 0x7fff000000000000) != 0) {
        puVar4[1] = uVar6 + 0x1000000000000;
        return;
      }
      this->exponent = -0x3ffe;
      return;
    }
    bVar5 = bVar1 & 0xf0 | bVar5;
  }
  this->field_0x12 = bVar5;
  return;
}

Assistant:

void IEEEFloat::initFromQuadrupleAPInt(const APInt &api) {
  assert(api.getBitWidth()==128);
  uint64_t i1 = api.getRawData()[0];
  uint64_t i2 = api.getRawData()[1];
  uint64_t myexponent = (i2 >> 48) & 0x7fff;
  uint64_t mysignificand  = i1;
  uint64_t mysignificand2 = i2 & 0xffffffffffffLL;

  initialize(&semIEEEquad);
  assert(partCount()==2);

  sign = static_cast<unsigned int>(i2>>63);
  if (myexponent==0 &&
      (mysignificand==0 && mysignificand2==0)) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x7fff &&
             (mysignificand==0 && mysignificand2==0)) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if (myexponent==0x7fff &&
             (mysignificand!=0 || mysignificand2 !=0)) {
    // exponent meaningless
    category = fcNaN;
    significandParts()[0] = mysignificand;
    significandParts()[1] = mysignificand2;
  } else {
    category = fcNormal;
    exponent = myexponent - 16383;
    significandParts()[0] = mysignificand;
    significandParts()[1] = mysignificand2;
    if (myexponent==0)          // denormal
      exponent = -16382;
    else
      significandParts()[1] |= 0x1000000000000LL;  // integer bit
  }
}